

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barrier.hpp
# Opt level: O2

__pid_t __thiscall gmlc::concurrency::Barrier::wait(Barrier *this,void *__stat_loc)

{
  size_t *psVar1;
  __pid_t extraout_EAX;
  anon_class_16_2_3fe218ff __p;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> uStack_18;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->mtx);
  psVar1 = &this->count_;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    this->generation_ = this->generation_ + 1;
    this->count_ = this->threshold_;
    std::condition_variable::notify_all();
  }
  else {
    __p.lGen = this->generation_;
    __p.this = this;
    std::condition_variable::wait<gmlc::concurrency::Barrier::wait()::_lambda()_1_>
              (&this->cv,&uStack_18,__p);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  return extraout_EAX;
}

Assistant:

void wait()
        {
            std::unique_lock<std::mutex> lck(mtx);
            auto lGen = generation_;
            if (--count_ <= 0) {
                generation_++;
                count_ = threshold_;
                cv.notify_all();
            } else {
                cv.wait(lck, [this, lGen] { return lGen != generation_; });
            }
        }